

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::vector<unsigned_char>_>::push_back
          (vector<crnlib::vector<unsigned_char>_> *this,vector<unsigned_char> *obj)

{
  uint uVar1;
  
  uVar1 = this->m_size;
  if (this->m_capacity <= uVar1) {
    increase_capacity(this,uVar1 + 1,true,false);
    uVar1 = this->m_size;
  }
  vector<unsigned_char>::vector(this->m_p + uVar1,obj);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void push_back(const T& obj)
        {
            CRNLIB_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

            if (m_size >= m_capacity)
            {
                increase_capacity(m_size + 1, true);
            }

            scalar_type<T>::construct(m_p + m_size, obj);
            m_size++;
        }